

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect.c
# Opt level: O3

void print_valtypes(wasm_valtype_vec_t *types)

{
  bool bVar1;
  ulong uVar2;
  
  if (types->size != 0) {
    bVar1 = true;
    uVar2 = 0;
    do {
      if (!bVar1) {
        putchar(0x20);
      }
      print_valtype(types->data[uVar2]);
      uVar2 = uVar2 + 1;
      bVar1 = false;
    } while (uVar2 < types->size);
  }
  return;
}

Assistant:

void print_valtypes(const wasm_valtype_vec_t* types) {
  bool first = true;
  for (size_t i = 0; i < types->size; ++i) {
    if (first) {
      first = false;
    } else {
      printf(" ");
    }
    print_valtype(types->data[i]);
  }
}